

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestModelFactory.h
# Opt level: O0

aiScene * Assimp::TestModelFacttory::createDefaultTestModel(float *opacity)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  aiScene *this;
  aiMaterial **ppaVar4;
  aiMaterial *this_00;
  char *pcVar5;
  time_t tVar6;
  ulong uVar7;
  aiMesh **ppaVar8;
  aiMesh *this_01;
  aiVector3D *paVar9;
  ulong uVar10;
  ulong *puVar11;
  uint *puVar12;
  aiNode *this_02;
  aiFace *paVar13;
  ulong uVar14;
  aiFace *local_138;
  aiVector3t<float> *local_100;
  aiVector3t<float> local_a4;
  aiVector3t<float> local_98;
  aiVector3t<float> local_8c;
  AssertHelper local_80;
  Message local_78;
  aiReturn local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  aiReturn local_48 [2];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiColor3D color;
  aiScene *scene;
  float *opacity_local;
  
  this = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this);
  this->mNumMaterials = 1;
  ppaVar4 = (aiMaterial **)operator_new__((ulong)this->mNumMaterials << 3);
  this->mMaterials = ppaVar4;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  *this->mMaterials = this_00;
  aiColor3D::aiColor3D((aiColor3D *)&gtest_ar.message_,1.0,0.0,0.0);
  local_48[1] = 0;
  local_48[0] = aiMaterial::AddProperty
                          (*this->mMaterials,(aiColor3D *)&gtest_ar.message_,1,"$clr.diffuse",0,0);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_40,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &color, 1, \"$clr.diffuse\",0,0 )",local_48 + 1,
             local_48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(&local_50);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  iVar3 = rand();
  *opacity = (float)iVar3 * 4.656613e-10;
  local_70[1] = 0;
  local_70[0] = aiMaterial::AddProperty(*this->mMaterials,opacity,1,"$mat.opacity",0,0);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_68,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, \"$mat.opacity\",0,0 )",local_70 + 1
             ,local_70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  this->mNumMeshes = 1;
  auVar1 = ZEXT416(this->mNumMeshes) * ZEXT816(8);
  uVar7 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  ppaVar8 = (aiMesh **)operator_new__(uVar7);
  this->mMeshes = ppaVar8;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  *this->mMeshes = this_01;
  (*this->mMeshes)->mMaterialIndex = 0;
  (*this->mMeshes)->mPrimitiveTypes = 4;
  (*this->mMeshes)->mNumVertices = 3;
  paVar9 = (aiVector3D *)operator_new__(0x24);
  local_100 = paVar9;
  do {
    aiVector3t<float>::aiVector3t(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != paVar9 + 3);
  (*this->mMeshes)->mVertices = paVar9;
  aiVector3t<float>::aiVector3t(&local_8c,1.0,0.0,0.0);
  paVar9 = (*this->mMeshes)->mVertices;
  paVar9->x = local_8c.x;
  paVar9->y = local_8c.y;
  paVar9->z = local_8c.z;
  aiVector3t<float>::aiVector3t(&local_98,0.0,1.0,0.0);
  paVar9 = (*this->mMeshes)->mVertices;
  paVar9[1].x = local_98.x;
  paVar9[1].y = local_98.y;
  paVar9[1].z = local_98.z;
  aiVector3t<float>::aiVector3t(&local_a4,0.0,0.0,1.0);
  paVar9 = (*this->mMeshes)->mVertices;
  paVar9[2].x = local_a4.x;
  paVar9[2].y = local_a4.y;
  paVar9[2].z = local_a4.z;
  (*this->mMeshes)->mNumFaces = 1;
  uVar7 = CONCAT44(0,(*this->mMeshes)->mNumFaces);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar10 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar14 = uVar10 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar10) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar14);
  *puVar11 = uVar7;
  paVar13 = (aiFace *)(puVar11 + 1);
  if (uVar7 != 0) {
    local_138 = paVar13;
    do {
      aiFace::aiFace(local_138);
      local_138 = local_138 + 1;
    } while (local_138 != paVar13 + uVar7);
  }
  (*this->mMeshes)->mFaces = paVar13;
  (*this->mMeshes)->mFaces->mNumIndices = 3;
  puVar12 = (uint *)operator_new__(0xc);
  (*this->mMeshes)->mFaces->mIndices = puVar12;
  *(*this->mMeshes)->mFaces->mIndices = 0;
  (*this->mMeshes)->mFaces->mIndices[1] = 1;
  (*this->mMeshes)->mFaces->mIndices[2] = 2;
  this_02 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_02);
  this->mRootNode = this_02;
  this->mRootNode->mNumMeshes = 1;
  puVar12 = (uint *)operator_new__(4);
  *puVar12 = 0;
  this->mRootNode->mMeshes = puVar12;
  return this;
}

Assistant:

static aiScene *createDefaultTestModel( float &opacity ) {
        aiScene *scene( new aiScene );
        scene->mNumMaterials = 1;
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        scene->mMaterials[ 0 ] = new aiMaterial;
        aiColor3D color( 1, 0, 0 );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &color, 1, AI_MATKEY_COLOR_DIFFUSE ) );

        ::srand( static_cast< unsigned int >( ::time( NULL ) ) );
        opacity = float( rand() ) / float( RAND_MAX );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, AI_MATKEY_OPACITY ) );

        scene->mNumMeshes = 1;
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        scene->mMeshes[ 0 ] = new aiMesh;
        scene->mMeshes[ 0 ]->mMaterialIndex = 0;
        scene->mMeshes[ 0 ]->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        scene->mMeshes[ 0 ]->mNumVertices = 3;
        scene->mMeshes[ 0 ]->mVertices = new aiVector3D[ 3 ];
        scene->mMeshes[ 0 ]->mVertices[ 0 ] = aiVector3D( 1, 0, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 1 ] = aiVector3D( 0, 1, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 2 ] = aiVector3D( 0, 0, 1 );
        scene->mMeshes[ 0 ]->mNumFaces = 1;
        scene->mMeshes[ 0 ]->mFaces = new aiFace[scene->mMeshes[ 0 ]->mNumFaces];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mNumIndices = 3;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices = new unsigned int[ 3 ];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 0 ] = 0;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 1 ] = 1;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 2 ] = 2;

        scene->mRootNode = new aiNode();
        scene->mRootNode->mNumMeshes = 1;
        scene->mRootNode->mMeshes = new unsigned int[1]{ 0 };

        return scene;
    }